

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O1

ServiceDescriptor * perfetto::protos::gen::ConsumerPort::NewDescriptor(void)

{
  vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  *this;
  pointer *ppMVar1;
  iterator iVar2;
  ServiceDescriptor *pSVar3;
  Method local_30;
  
  pSVar3 = (ServiceDescriptor *)operator_new(0x20);
  pSVar3->service_name = (char *)0x0;
  (pSVar3->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  (pSVar3->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  (pSVar3->methods).
  super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  pSVar3->service_name = "ConsumerPort";
  this = &pSVar3->methods;
  local_30.name = "EnableTracing";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::EnableTracingRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::EnableTracingResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::EnableTracingRequest,_perfetto::protos::gen::EnableTracingResponse,_&perfetto::protos::gen::ConsumerPort::EnableTracing>
  ;
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::EnableTracingResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::EnableTracingRequest,_perfetto::protos::gen::EnableTracingResponse,_&perfetto::protos::gen::ConsumerPort::EnableTracing>
    ;
    (iVar2._M_current)->name = "EnableTracing";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::EnableTracingRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "DisableTracing";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DisableTracingRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DisableTracingResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DisableTracingRequest,_perfetto::protos::gen::DisableTracingResponse,_&perfetto::protos::gen::ConsumerPort::DisableTracing>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::DisableTracingResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DisableTracingRequest,_perfetto::protos::gen::DisableTracingResponse,_&perfetto::protos::gen::ConsumerPort::DisableTracing>
    ;
    (iVar2._M_current)->name = "DisableTracing";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::DisableTracingRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "ReadBuffers";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ReadBuffersRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ReadBuffersResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ReadBuffersRequest,_perfetto::protos::gen::ReadBuffersResponse,_&perfetto::protos::gen::ConsumerPort::ReadBuffers>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ReadBuffersResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ReadBuffersRequest,_perfetto::protos::gen::ReadBuffersResponse,_&perfetto::protos::gen::ConsumerPort::ReadBuffers>
    ;
    (iVar2._M_current)->name = "ReadBuffers";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ReadBuffersRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "FreeBuffers";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FreeBuffersRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FreeBuffersResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FreeBuffersRequest,_perfetto::protos::gen::FreeBuffersResponse,_&perfetto::protos::gen::ConsumerPort::FreeBuffers>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::FreeBuffersResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FreeBuffersRequest,_perfetto::protos::gen::FreeBuffersResponse,_&perfetto::protos::gen::ConsumerPort::FreeBuffers>
    ;
    (iVar2._M_current)->name = "FreeBuffers";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::FreeBuffersRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "Flush";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FlushRequest,_perfetto::protos::gen::FlushResponse,_&perfetto::protos::gen::ConsumerPort::Flush>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::FlushRequest,_perfetto::protos::gen::FlushResponse,_&perfetto::protos::gen::ConsumerPort::Flush>
    ;
    (iVar2._M_current)->name = "Flush";
    (iVar2._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::FlushRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "StartTracing";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::StartTracingRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::StartTracingResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::StartTracingRequest,_perfetto::protos::gen::StartTracingResponse,_&perfetto::protos::gen::ConsumerPort::StartTracing>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::StartTracingResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::StartTracingRequest,_perfetto::protos::gen::StartTracingResponse,_&perfetto::protos::gen::ConsumerPort::StartTracing>
    ;
    (iVar2._M_current)->name = "StartTracing";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::StartTracingRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "ChangeTraceConfig";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ChangeTraceConfigRequest,_perfetto::protos::gen::ChangeTraceConfigResponse,_&perfetto::protos::gen::ConsumerPort::ChangeTraceConfig>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ChangeTraceConfigRequest,_perfetto::protos::gen::ChangeTraceConfigResponse,_&perfetto::protos::gen::ConsumerPort::ChangeTraceConfig>
    ;
    (iVar2._M_current)->name = "ChangeTraceConfig";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ChangeTraceConfigRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "Detach";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DetachRequest,_perfetto::protos::gen::DetachResponse,_&perfetto::protos::gen::ConsumerPort::Detach>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::DetachRequest,_perfetto::protos::gen::DetachResponse,_&perfetto::protos::gen::ConsumerPort::Detach>
    ;
    (iVar2._M_current)->name = "Detach";
    (iVar2._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::DetachRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "Attach";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::AttachRequest,_perfetto::protos::gen::AttachResponse,_&perfetto::protos::gen::ConsumerPort::Attach>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::AttachRequest,_perfetto::protos::gen::AttachResponse,_&perfetto::protos::gen::ConsumerPort::Attach>
    ;
    (iVar2._M_current)->name = "Attach";
    (iVar2._M_current)->request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::AttachRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "GetTraceStats";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetTraceStatsRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::GetTraceStatsResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::GetTraceStatsRequest,_perfetto::protos::gen::GetTraceStatsResponse,_&perfetto::protos::gen::ConsumerPort::GetTraceStats>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::GetTraceStatsResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::GetTraceStatsRequest,_perfetto::protos::gen::GetTraceStatsResponse,_&perfetto::protos::gen::ConsumerPort::GetTraceStats>
    ;
    (iVar2._M_current)->name = "GetTraceStats";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::GetTraceStatsRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "ObserveEvents";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ObserveEventsRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::ObserveEventsResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ObserveEventsRequest,_perfetto::protos::gen::ObserveEventsResponse,_&perfetto::protos::gen::ConsumerPort::ObserveEvents>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ObserveEventsResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::ObserveEventsRequest,_perfetto::protos::gen::ObserveEventsResponse,_&perfetto::protos::gen::ConsumerPort::ObserveEvents>
    ;
    (iVar2._M_current)->name = "ObserveEvents";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::ObserveEventsRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "QueryServiceState";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryServiceStateRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryServiceStateResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryServiceStateRequest,_perfetto::protos::gen::QueryServiceStateResponse,_&perfetto::protos::gen::ConsumerPort::QueryServiceState>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryServiceStateResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryServiceStateRequest,_perfetto::protos::gen::QueryServiceStateResponse,_&perfetto::protos::gen::ConsumerPort::QueryServiceState>
    ;
    (iVar2._M_current)->name = "QueryServiceState";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryServiceStateRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "QueryCapabilities";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesRequest>;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryCapabilitiesRequest,_perfetto::protos::gen::QueryCapabilitiesResponse,_&perfetto::protos::gen::ConsumerPort::QueryCapabilities>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::QueryCapabilitiesRequest,_perfetto::protos::gen::QueryCapabilitiesResponse,_&perfetto::protos::gen::ConsumerPort::QueryCapabilities>
    ;
    (iVar2._M_current)->name = "QueryCapabilities";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::QueryCapabilitiesRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  iVar2._M_current =
       (pSVar3->methods).
       super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
       ._M_impl.super__Vector_impl_data._M_finish;
  local_30.name = "SaveTraceForBugreport";
  local_30.request_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportRequest>
  ;
  local_30.reply_proto_decoder = _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportResponse>;
  local_30.invoker =
       _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::SaveTraceForBugreportRequest,_perfetto::protos::gen::SaveTraceForBugreportResponse,_&perfetto::protos::gen::ConsumerPort::SaveTraceForBugreport>
  ;
  if (iVar2._M_current ==
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage) {
    std::
    vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
    ::_M_realloc_insert<perfetto::ipc::ServiceDescriptor::Method>(this,iVar2,&local_30);
  }
  else {
    (iVar2._M_current)->reply_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportResponse>;
    (iVar2._M_current)->invoker =
         _IPC_Invoker<perfetto::protos::gen::ConsumerPort,_perfetto::protos::gen::SaveTraceForBugreportRequest,_perfetto::protos::gen::SaveTraceForBugreportResponse,_&perfetto::protos::gen::ConsumerPort::SaveTraceForBugreport>
    ;
    (iVar2._M_current)->name = "SaveTraceForBugreport";
    (iVar2._M_current)->request_proto_decoder =
         _IPC_Decoder<perfetto::protos::gen::SaveTraceForBugreportRequest>;
    ppMVar1 = &(pSVar3->methods).
               super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
               ._M_impl.super__Vector_impl_data._M_finish;
    *ppMVar1 = *ppMVar1 + 1;
  }
  if ((pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage !=
      (pSVar3->methods).
      super__Vector_base<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>
      ._M_impl.super__Vector_impl_data._M_finish) {
    std::
    __shrink_to_fit_aux<std::vector<perfetto::ipc::ServiceDescriptor::Method,_std::allocator<perfetto::ipc::ServiceDescriptor::Method>_>,_true>
    ::_S_do_it(this);
  }
  return pSVar3;
}

Assistant:

::perfetto::ipc::ServiceDescriptor* ConsumerPort::NewDescriptor() {
  auto* desc = new ::perfetto::ipc::ServiceDescriptor();
  desc->service_name = "ConsumerPort";

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "EnableTracing",
     &_IPC_Decoder<EnableTracingRequest>,
     &_IPC_Decoder<EnableTracingResponse>,
     &_IPC_Invoker<ConsumerPort, EnableTracingRequest, EnableTracingResponse, &ConsumerPort::EnableTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "DisableTracing",
     &_IPC_Decoder<DisableTracingRequest>,
     &_IPC_Decoder<DisableTracingResponse>,
     &_IPC_Invoker<ConsumerPort, DisableTracingRequest, DisableTracingResponse, &ConsumerPort::DisableTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ReadBuffers",
     &_IPC_Decoder<ReadBuffersRequest>,
     &_IPC_Decoder<ReadBuffersResponse>,
     &_IPC_Invoker<ConsumerPort, ReadBuffersRequest, ReadBuffersResponse, &ConsumerPort::ReadBuffers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "FreeBuffers",
     &_IPC_Decoder<FreeBuffersRequest>,
     &_IPC_Decoder<FreeBuffersResponse>,
     &_IPC_Invoker<ConsumerPort, FreeBuffersRequest, FreeBuffersResponse, &ConsumerPort::FreeBuffers>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Flush",
     &_IPC_Decoder<FlushRequest>,
     &_IPC_Decoder<FlushResponse>,
     &_IPC_Invoker<ConsumerPort, FlushRequest, FlushResponse, &ConsumerPort::Flush>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "StartTracing",
     &_IPC_Decoder<StartTracingRequest>,
     &_IPC_Decoder<StartTracingResponse>,
     &_IPC_Invoker<ConsumerPort, StartTracingRequest, StartTracingResponse, &ConsumerPort::StartTracing>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ChangeTraceConfig",
     &_IPC_Decoder<ChangeTraceConfigRequest>,
     &_IPC_Decoder<ChangeTraceConfigResponse>,
     &_IPC_Invoker<ConsumerPort, ChangeTraceConfigRequest, ChangeTraceConfigResponse, &ConsumerPort::ChangeTraceConfig>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Detach",
     &_IPC_Decoder<DetachRequest>,
     &_IPC_Decoder<DetachResponse>,
     &_IPC_Invoker<ConsumerPort, DetachRequest, DetachResponse, &ConsumerPort::Detach>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "Attach",
     &_IPC_Decoder<AttachRequest>,
     &_IPC_Decoder<AttachResponse>,
     &_IPC_Invoker<ConsumerPort, AttachRequest, AttachResponse, &ConsumerPort::Attach>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "GetTraceStats",
     &_IPC_Decoder<GetTraceStatsRequest>,
     &_IPC_Decoder<GetTraceStatsResponse>,
     &_IPC_Invoker<ConsumerPort, GetTraceStatsRequest, GetTraceStatsResponse, &ConsumerPort::GetTraceStats>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "ObserveEvents",
     &_IPC_Decoder<ObserveEventsRequest>,
     &_IPC_Decoder<ObserveEventsResponse>,
     &_IPC_Invoker<ConsumerPort, ObserveEventsRequest, ObserveEventsResponse, &ConsumerPort::ObserveEvents>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "QueryServiceState",
     &_IPC_Decoder<QueryServiceStateRequest>,
     &_IPC_Decoder<QueryServiceStateResponse>,
     &_IPC_Invoker<ConsumerPort, QueryServiceStateRequest, QueryServiceStateResponse, &ConsumerPort::QueryServiceState>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "QueryCapabilities",
     &_IPC_Decoder<QueryCapabilitiesRequest>,
     &_IPC_Decoder<QueryCapabilitiesResponse>,
     &_IPC_Invoker<ConsumerPort, QueryCapabilitiesRequest, QueryCapabilitiesResponse, &ConsumerPort::QueryCapabilities>});

  desc->methods.emplace_back(::perfetto::ipc::ServiceDescriptor::Method{
     "SaveTraceForBugreport",
     &_IPC_Decoder<SaveTraceForBugreportRequest>,
     &_IPC_Decoder<SaveTraceForBugreportResponse>,
     &_IPC_Invoker<ConsumerPort, SaveTraceForBugreportRequest, SaveTraceForBugreportResponse, &ConsumerPort::SaveTraceForBugreport>});
  desc->methods.shrink_to_fit();
  return desc;
}